

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::InnerProduct_x86_avx::forward_fp16s
          (InnerProduct_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  _func_int *p_Var2;
  int *piVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  Option opt_flatten;
  Mat local_c8;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *pAStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  local_c8.dims = bottom_blob->dims;
  if (local_c8.dims == 2) {
    iVar4 = *(int *)(&this->field_0xd8 + (long)this->_vptr_InnerProduct_x86_avx[-3]) /
            *(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx[-3]);
    local_c8.w = bottom_blob->w;
    if (bottom_blob->w == iVar4) {
      local_c8.w = iVar4;
      if (1 < bottom_blob->elempack * bottom_blob->h) {
        Mat::create(top_blob,*(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx[-3]
                                     ),bottom_blob->h,bottom_blob->elemsize,bottom_blob->elempack,
                    opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        p_Var2 = this->_vptr_InnerProduct_x86_avx[-3];
        iVar4 = *(int *)(&this->field_0xe0 + (long)p_Var2);
        iVar5 = cpu_support_x86_f16c();
        if (iVar5 == 0) {
          return 0;
        }
        innerproduct_gemm_fp16s_sse_f16c
                  (bottom_blob,top_blob,&this->weight_data_tm,
                   (Mat *)(&this->field_0x178 + (long)p_Var2),iVar4,
                   (Mat *)(&this->field_0xe8 + (long)p_Var2),opt);
        return 0;
      }
    }
  }
  else {
    local_c8.w = bottom_blob->w;
  }
  piVar3 = bottom_blob->refcount;
  local_c8.data = bottom_blob->data;
  local_c8.refcount = bottom_blob->refcount;
  local_c8.elemsize = bottom_blob->elemsize;
  local_c8.elempack = bottom_blob->elempack;
  local_c8.allocator = bottom_blob->allocator;
  local_c8.h = bottom_blob->h;
  local_c8.d = bottom_blob->d;
  local_c8.c = bottom_blob->c;
  local_c8.cstep = bottom_blob->cstep;
  iVar4 = local_c8.dims;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
    iVar4 = bottom_blob->dims;
  }
  if (iVar4 != 1) {
    local_78._0_1_ = opt->lightmode;
    local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
    local_78._4_4_ = opt->num_threads;
    pAStack_68 = opt->workspace_allocator;
    uStack_60._0_4_ = opt->openmp_blocktime;
    uStack_60._4_1_ = opt->use_winograd_convolution;
    uStack_60._5_1_ = opt->use_sgemm_convolution;
    uStack_60._6_1_ = opt->use_int8_inference;
    uStack_60._7_1_ = opt->use_vulkan_compute;
    local_58._0_1_ = opt->use_bf16_storage;
    local_58._1_1_ = opt->use_fp16_packed;
    local_58._2_1_ = opt->use_fp16_storage;
    local_58._3_1_ = opt->use_fp16_arithmetic;
    local_58._4_1_ = opt->use_int8_packed;
    local_58._5_1_ = opt->use_int8_storage;
    local_58._6_1_ = opt->use_int8_arithmetic;
    local_58._7_1_ = opt->use_packing_layout;
    uStack_50._0_1_ = opt->use_shader_pack8;
    uStack_50._1_1_ = opt->use_subgroup_basic;
    uStack_50._2_1_ = opt->use_subgroup_vote;
    uStack_50._3_1_ = opt->use_subgroup_ballot;
    uStack_50._4_1_ = opt->use_subgroup_shuffle;
    uStack_50._5_1_ = opt->use_image_storage;
    uStack_50._6_1_ = opt->use_tensor_storage;
    uStack_50._7_1_ = opt->use_reserved_0;
    uStack_48._0_4_ = opt->flush_denormals;
    uStack_48._4_1_ = opt->use_local_pool_allocator;
    uStack_48._5_1_ = opt->use_shader_local_memory;
    uStack_48._6_1_ = opt->use_cooperative_matrix;
    uStack_48._7_1_ = opt->use_winograd23_convolution;
    uStack_40._0_1_ = opt->use_winograd43_convolution;
    uStack_40._1_1_ = opt->use_winograd63_convolution;
    uStack_40._2_1_ = opt->use_reserved_6;
    uStack_40._3_1_ = opt->use_reserved_7;
    uStack_40._4_1_ = opt->use_reserved_8;
    uStack_40._5_1_ = opt->use_reserved_9;
    uStack_40._6_1_ = opt->use_reserved_10;
    uStack_40._7_1_ = opt->use_reserved_11;
    pAStack_70 = opt->workspace_allocator;
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,&local_c8);
  }
  uVar1 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx[-3]);
  lVar8 = 1;
  if (opt->use_packing_layout == true) {
    lVar8 = 8;
    if ((uVar1 & 7) != 0) {
      lVar8 = (ulong)((uVar1 & 3) == 0) * 3 + 1;
    }
  }
  iVar5 = (int)lVar8;
  Mat::create(top_blob,(int)uVar1 / iVar5,
              lVar8 * (local_c8.elemsize / (ulong)(long)local_c8.elempack),iVar5,opt->blob_allocator
             );
  iVar4 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    iVar7 = 0;
    iVar4 = iVar7;
    if (iVar5 == 1) {
      p_Var2 = this->_vptr_InnerProduct_x86_avx[-3];
      iVar5 = *(int *)(&this->field_0xe0 + (long)p_Var2);
      iVar7 = cpu_support_x86_f16c();
      if (iVar7 != 0) {
        innerproduct_fp16s_sse_f16c
                  (&local_c8,top_blob,&this->weight_data_tm,
                   (Mat *)(&this->field_0x178 + (long)p_Var2),iVar5,
                   (Mat *)(&this->field_0xe8 + (long)p_Var2),opt);
      }
    }
    else if (iVar5 == 4) {
      p_Var2 = this->_vptr_InnerProduct_x86_avx[-3];
      iVar5 = *(int *)(&this->field_0xe0 + (long)p_Var2);
      iVar7 = cpu_support_x86_f16c();
      if (iVar7 != 0) {
        innerproduct_fp16s_pack4_sse_f16c
                  (&local_c8,top_blob,&this->weight_data_tm,
                   (Mat *)(&this->field_0x178 + (long)p_Var2),iVar5,
                   (Mat *)(&this->field_0xe8 + (long)p_Var2),opt);
      }
    }
    else {
      iVar4 = 0;
      if (iVar5 == 8) {
        p_Var2 = this->_vptr_InnerProduct_x86_avx[-3];
        iVar5 = *(int *)(&this->field_0xe0 + (long)p_Var2);
        iVar6 = cpu_support_x86_f16c();
        iVar4 = iVar7;
        if (iVar6 != 0) {
          innerproduct_fp16s_pack8_avx_f16c
                    (&local_c8,top_blob,&this->weight_data_tm,
                     (Mat *)(&this->field_0x178 + (long)p_Var2),iVar5,
                     (Mat *)(&this->field_0xe8 + (long)p_Var2),opt);
        }
      }
    }
  }
  if (local_c8.refcount != (int *)0x0) {
    LOCK();
    *local_c8.refcount = *local_c8.refcount + -1;
    UNLOCK();
    if (*local_c8.refcount == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if (local_c8.data != (void *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar4;
}

Assistant:

int InnerProduct_x86_avx::forward_fp16s(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input && bottom_blob.h * bottom_blob.elempack > 1)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_fp16s_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#endif
    }
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __AVX512F__
    if (out_elempack == 16)
    {
        innerproduct_fp16s_pack16_avx512(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }
#endif // __AVX512F__

    if (out_elempack == 8)
    {
        innerproduct_fp16s_pack8_avx(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }

    if (out_elempack == 4)
    {
        innerproduct_fp16s_pack4_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }

    if (out_elempack == 1)
    {
        innerproduct_fp16s_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }

    return 0;
}